

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O1

optional<OutlineCommandData> *
getArgumentToCommand
          (optional<OutlineCommandData> *__return_storage_ptr__,TSNode commandNode,File *file,
          bool hasStar)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char16_t cVar2;
  TSNode self;
  TSNode self_00;
  TSNode self_01;
  TSNode self_02;
  TSNode self_03;
  TSNode node_00;
  TSNode self_04;
  TSNode self_05;
  TSNode self_06;
  long lVar3;
  undefined8 *puVar4;
  size_type sVar5;
  _Bool _Var6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  char *pcVar10;
  TSPoint TVar11;
  Point PVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  TSNode node;
  string text;
  u16string text_1;
  undefined1 uVar18;
  undefined8 in_stack_fffffffffffffec0;
  undefined8 uVar19;
  codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  TSTree *in_stack_fffffffffffffed8;
  TSTree *pTStack_120;
  undefined1 local_118 [40];
  _Alloc_hider _Stack_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  aStack_e0;
  state_type sStack_d0;
  size_t local_c8;
  ulong uStack_c0;
  undefined8 *local_b8;
  string local_b0;
  uint local_90;
  uint uStack_8c;
  byte local_88;
  File *local_80;
  undefined8 *local_78;
  u16string local_70;
  u16string local_50;
  
  self_05.context._8_8_ = in_stack_fffffffffffffec8;
  self_05.context._0_8_ = in_stack_fffffffffffffec0;
  self_05.id = in_stack_fffffffffffffed0;
  self_05.tree = in_stack_fffffffffffffed8;
  local_80 = file;
  ts_node_next_named_sibling(self_05);
  self.context._8_8_ = in_stack_fffffffffffffed0;
  self.context._0_8_ = in_stack_fffffffffffffec8;
  self.id = in_stack_fffffffffffffed8;
  self.tree = pTStack_120;
  _Var6 = ts_node_is_null(self);
  if (!_Var6) {
    local_b8 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
                       super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                       super__Optional_payload_base<OutlineCommandData>._M_payload + 0x10);
    local_78 = (undefined8 *)
               ((long)&(__return_storage_ptr__->
                       super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
                       super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                       super__Optional_payload_base<OutlineCommandData>._M_payload + 0x20);
    bVar7 = true;
    uVar19 = 0;
    do {
      self_00.context._8_8_ = in_stack_fffffffffffffed0;
      self_00.context._0_8_ = in_stack_fffffffffffffec8;
      self_00.id = in_stack_fffffffffffffed8;
      self_00.tree = pTStack_120;
      pcVar10 = ts_node_type(self_00);
      iVar8 = strcmp(pcVar10,"group");
      if (iVar8 == 0) {
        node_00.context._8_8_ = in_stack_fffffffffffffed0;
        node_00.context._0_8_ = in_stack_fffffffffffffec8;
        node_00.id = in_stack_fffffffffffffed8;
        node_00.tree = pTStack_120;
        getGroupText_abi_cxx11_(&local_b0,node_00,local_80);
        uVar18 = (undefined1)uVar19;
        local_118._0_8_ = (long)local_118 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        self_04.context._8_8_ = in_stack_fffffffffffffed0;
        self_04.context._0_8_ = in_stack_fffffffffffffec8;
        self_04.id = in_stack_fffffffffffffed8;
        self_04.tree = pTStack_120;
        TVar11 = ts_node_end_point(self_04);
        puVar4 = local_b8;
        local_118._32_8_ = fromTSPoint(TVar11);
        _Stack_f0._M_p = (pointer)(CONCAT71(_Stack_f0._M_p._1_7_,uVar18) & 0xffffffffffffff01);
        *(undefined8 **)
         &(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
          _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
          super__Optional_payload_base<OutlineCommandData>._M_payload = puVar4;
        if (local_118._0_8_ == (long)local_118 + 0x10U) {
          *puVar4 = local_118._16_8_;
          puVar4[1] = local_118._24_8_;
        }
        else {
          (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
          _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
          super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name._M_dataplus =
               (_Alloc_hider)local_118._0_8_;
          (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
          _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
          super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.field_2.
          _M_allocated_capacity = local_118._16_8_;
        }
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name._M_string_length =
             local_118._8_8_;
        local_118._8_8_ = (pointer)0x0;
        local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.sawStar =
             (bool)_Stack_f0._M_p._0_1_;
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.endPoint =
             (Point)local_118._32_8_;
        (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
        super__Optional_payload<OutlineCommandData,_true,_false,_false>.
        super__Optional_payload_base<OutlineCommandData>._M_engaged = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
          return __return_storage_ptr__;
        }
        local_118._0_8_ = (long)local_118 + 0x10U;
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
        return __return_storage_ptr__;
      }
      self_01.context._8_8_ = in_stack_fffffffffffffed0;
      self_01.context._0_8_ = in_stack_fffffffffffffec8;
      self_01.id = in_stack_fffffffffffffed8;
      self_01.tree = pTStack_120;
      pcVar10 = ts_node_type(self_01);
      iVar8 = strcmp(pcVar10,"text");
      if (iVar8 == 0) {
        self_02.context._8_8_ = in_stack_fffffffffffffed0;
        self_02.context._0_8_ = in_stack_fffffffffffffec8;
        self_02.id = in_stack_fffffffffffffed8;
        self_02.tree = pTStack_120;
        TVar11 = ts_node_start_point(self_02);
        PVar12 = fromTSPoint(TVar11);
        File::textForNode_abi_cxx11_(&local_50,local_80,(TSNode *)&stack0xfffffffffffffec8);
        sVar5 = local_50._M_string_length;
        if (local_50._M_string_length == 0) {
          bVar17 = true;
        }
        else {
          uVar16 = (ulong)PVar12 >> 0x20;
          uVar13 = 0;
          do {
            cVar2 = local_50._M_dataplus._M_p[uVar13];
            uVar15 = (int)uVar16 + 1;
            uVar16 = (ulong)uVar15;
            uVar9 = 6;
            uVar14 = PVar12.row;
            if ((ushort)cVar2 < 0x20) {
              if (cVar2 != L'\t') {
                if (cVar2 == L'\n') {
                  if (!bVar7) {
                    (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)
                    ._M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                    super__Optional_payload_base<OutlineCommandData>._M_engaged = false;
                    goto LAB_0019cb42;
                  }
                  goto LAB_0019c8ae;
                }
LAB_0019c8e4:
                local_c8 = 0;
                uStack_c0 = 0;
                aStack_e0._8_8_ = 0;
                sStack_d0.__count = 0;
                sStack_d0.__value = (anon_union_4_2_91654ee9_for___value)0x0;
                local_e8 = 0;
                aStack_e0._M_allocated_capacity = 0;
                local_118._32_8_ = 0;
                _Stack_f0._M_p = (pointer)0x0;
                local_118._16_8_ = 0;
                local_118._24_8_ = 0;
                local_118._0_8_ =
                     (_Tuple_impl<0UL,_std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_*,_std::default_delete<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>_>_>
                      )0x0;
                local_118._8_8_ = (pointer)0x0;
                local_118._0_8_ = operator_new(0x20);
                *(undefined4 *)
                 &((codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *)local_118._0_8_)
                  ->field_0x8 = 0;
                *(undefined8 *)
                 &((codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *)local_118._0_8_)
                  ->field_0x10 = 0x10ffff;
                *(undefined4 *)
                 &((codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *)local_118._0_8_)
                  ->field_0x18 = 0;
                *(undefined ***)local_118._0_8_ = &PTR____codecvt_utf8_utf16_base_0021ab90;
                local_118._8_8_ = (long)local_118 + 0x18;
                local_118._16_8_ = (TSTree *)0x0;
                local_118._24_8_ = local_118._24_8_ & 0xffffffffffffff00;
                _Stack_f0._M_p = (pointer)((long)local_118 + 0x38);
                local_e8 = 0;
                aStack_e0._M_allocated_capacity =
                     aStack_e0._M_allocated_capacity & 0xffffffffffff0000;
                uStack_c0 = uStack_c0 & 0xffffffffffff0000;
                sStack_d0.__count = 0;
                sStack_d0.__value = (anon_union_4_2_91654ee9_for___value)0x0;
                local_c8 = 0;
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                local_70._M_string_length = 1;
                local_70.field_2._M_local_buf[1] = L'\0';
                local_70.field_2._M_local_buf[0] = cVar2;
                UtfHandler::utf16to8(&local_b0,(UtfHandler *)local_118,&local_70);
                local_88 = (byte)uVar19 & 1;
                *(undefined8 **)
                 &(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload = local_b8;
                paVar1 = &local_b0.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p == paVar1) {
                  *local_b8 = CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                       local_b0.field_2._M_local_buf[0]);
                  local_b8[1] = local_b0.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                  _M_dataplus = (_Alloc_hider)local_b0._M_dataplus._M_p;
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.field_2.
                  _M_allocated_capacity =
                       CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                local_b0.field_2._M_local_buf[0]);
                }
                (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                _M_string_length = local_b0._M_string_length;
                local_b0._M_string_length = 0;
                local_b0.field_2._M_local_buf[0] = '\0';
                *(byte *)(local_78 + 1) = local_88;
                *local_78 = CONCAT44(uVar15,uVar14);
                (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                super__Optional_payload_base<OutlineCommandData>._M_engaged = true;
                local_b0._M_dataplus._M_p = (pointer)paVar1;
                local_90 = uVar14;
                uStack_8c = uVar15;
                if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                           CONCAT22(local_70.field_2._M_local_buf[1],
                                                    local_70.field_2._M_local_buf[0])) * 2 + 2);
                }
                std::__cxx11::
                wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                ::~wstring_convert((wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                                    *)local_118);
                uVar9 = 1;
              }
            }
            else if (cVar2 != L' ') {
              if (cVar2 == L'*') {
                if ((hasStar & 1U) == 0) {
                  lVar3 = (long)local_118 + 0x10;
                  local_118._0_8_ = lVar3;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"*","");
                  local_118._32_8_ = CONCAT44(uVar15,uVar14);
                  _Stack_f0._M_p =
                       (pointer)(CONCAT71(_Stack_f0._M_p._1_7_,(char)uVar19) & 0xffffffffffffff01);
                  *(undefined8 **)
                   &(__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)
                    ._M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                    super__Optional_payload_base<OutlineCommandData>._M_payload = local_b8;
                  if (local_118._0_8_ == lVar3) {
                    *local_b8 = local_118._16_8_;
                    local_b8[1] = local_118._24_8_;
                  }
                  else {
                    (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)
                    ._M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                    super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                    _M_dataplus = (_Alloc_hider)local_118._0_8_;
                    (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)
                    ._M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                    super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                    field_2._M_allocated_capacity = local_118._16_8_;
                  }
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_payload._M_value.name.
                  _M_string_length = local_118._8_8_;
                  local_118._8_8_ = (pointer)0x0;
                  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
                  *(undefined1 *)(local_78 + 1) = _Stack_f0._M_p._0_1_;
                  *local_78 = local_118._32_8_;
                  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>).
                  _M_payload.super__Optional_payload<OutlineCommandData,_true,_false,_false>.
                  super__Optional_payload_base<OutlineCommandData>._M_engaged = true;
                  local_118._0_8_ = lVar3;
LAB_0019cb42:
                  uVar9 = 1;
                }
                else {
                  uVar19 = 1;
                  uVar9 = 0;
                  hasStar = false;
                }
              }
              else {
                if (cVar2 != L'%') goto LAB_0019c8e4;
                do {
                  if (sVar5 <= uVar13) break;
                  uVar13 = (ulong)((int)uVar13 + 1);
                } while (local_50._M_dataplus._M_p[uVar13] != L'\n');
LAB_0019c8ae:
                PVar12.row = uVar14 + 1;
                PVar12.column = 0;
                uVar9 = 0;
                uVar16 = 0;
                bVar7 = false;
              }
            }
            if ((uVar9 != 6) && (uVar9 != 0)) goto LAB_0019cb60;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (uVar13 < sVar5);
          uVar9 = 0;
LAB_0019cb60:
          bVar17 = (uVar9 & 3) == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
        }
        if (!bVar17) {
          return __return_storage_ptr__;
        }
      }
      self_06.context._8_8_ = in_stack_fffffffffffffec8;
      self_06.context[0] = (int)uVar19;
      self_06.context[1] = (int)((ulong)uVar19 >> 0x20);
      self_06.id = in_stack_fffffffffffffed0;
      self_06.tree = in_stack_fffffffffffffed8;
      ts_node_next_named_sibling(self_06);
      pTStack_120 = (TSTree *)local_118._24_8_;
      self_03.context[2] = local_118._8_4_;
      self_03.context[3] = local_118._12_4_;
      self_03.context[0] = local_118._0_4_;
      self_03.context[1] = local_118._4_4_;
      self_03.id = (void *)local_118._16_8_;
      self_03.tree = (TSTree *)local_118._24_8_;
      in_stack_fffffffffffffec8 =
           (codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0> *)local_118._0_8_;
      in_stack_fffffffffffffed0 = (pointer)local_118._8_8_;
      in_stack_fffffffffffffed8 = (TSTree *)local_118._16_8_;
      _Var6 = ts_node_is_null(self_03);
    } while (!_Var6);
  }
  (__return_storage_ptr__->super__Optional_base<OutlineCommandData,_false,_false>)._M_payload.
  super__Optional_payload<OutlineCommandData,_true,_false,_false>.
  super__Optional_payload_base<OutlineCommandData>._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<OutlineCommandData> getArgumentToCommand (TSNode commandNode, File &file, bool hasStar) {
    bool s_whitespace { true };
    bool sawStar { false };

    TSNode node = ts_node_next_named_sibling(commandNode);
    while (!ts_node_is_null(node)) {

        if (NODE_NAME_IS(node, "group")) {
            string text = getGroupText(node, file);

            return OutlineCommandData {
                text,
                fromTSPoint(ts_node_end_point(node)),
                sawStar
            };
        }

        if (NODE_NAME_IS(node, "text")) {
            Point point = fromTSPoint(ts_node_start_point(node));
            auto text = file.textForNode(node);
            auto len = text.size();

            for (unsigned int i = 0; i < len; i++) {
                auto c = text[i];
                point.column++; // points to column right of char

                if (c == ' ' || c == '\t') {
                    continue;
                } else if (c == '%') {
                    s_whitespace = false;
                    while (i < len) {
                        i++;
                        if (text[i] == '\n') { break; }
                    }
                    point.row++;
                    point.column = 0;
                } else if (c == '\n') {
                    if (!s_whitespace) {
                        return {};
                    }
                    point.row++;
                    point.column = 0;
                    s_whitespace = false;
                } else if (c == '*') {
                    if (hasStar) {
                        sawStar = true;
                        hasStar = false;
                    } else {
                        return OutlineCommandData{
                            "*",
                            point,
                            sawStar
                        };
                    }
                } else {
                    return OutlineCommandData {
                            UtfHandler().utf16to8(u16string { c }),
                            point,
                            sawStar
                    };
                }
            }
        }

        node = ts_node_next_named_sibling(node);
    }

    return {};
}